

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<double>::SolveSSOR
          (TPZMatrix<double> *this,int64_t *numiterations,TPZFMatrix<double> *F,
          TPZFMatrix<double> *result,TPZFMatrix<double> *residual,TPZFMatrix<double> *scratch,
          REAL overrelax,REAL *tol,int FromCurrent)

{
  bool bVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  double *in_stack_00000008;
  undefined4 in_stack_00000010;
  int fromcurrent;
  int64_t one;
  int64_t i;
  REAL res;
  undefined4 local_54;
  undefined8 local_50;
  long local_48;
  double local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  long *local_10;
  
  local_40 = *in_stack_00000008 + *in_stack_00000008 + 1.0;
  local_54 = in_stack_00000010;
  local_48 = 0;
  local_38 = in_XMM0_Qa;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  while( true ) {
    bVar1 = false;
    if (local_48 < *local_10) {
      bVar1 = ABS(*in_stack_00000008) < ABS(local_40);
    }
    if (!bVar1) break;
    local_50 = 1;
    local_40 = *in_stack_00000008;
    (**(code **)(*in_RDI + 0x1b8))
              (local_38,in_RDI,&local_50,local_18,local_20,local_28,local_30,&local_40,local_54,1);
    local_50 = 1;
    local_40 = *in_stack_00000008;
    local_54 = 1;
    (**(code **)(*in_RDI + 0x1b8))
              (local_38,in_RDI,&local_50,local_18,local_20,local_28,local_30,&local_40,1,0xffffffff)
    ;
    local_48 = local_48 + 1;
  }
  *local_10 = local_48;
  *in_stack_00000008 = local_40;
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSSOR(int64_t &numiterations, const TPZFMatrix<TVar> &F,
						  TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch, const REAL overrelax,
						  REAL &tol,const int FromCurrent) {
	REAL res = tol*2.+1.;
	int64_t i, one = 1;
	int fromcurrent = FromCurrent;
	for(i=0; i<numiterations && fabs(res) > fabs(tol); i++) {
		one = 1;
		res = tol;
		SolveSOR(one,F,result,residual,scratch,overrelax,res,fromcurrent,1);
		one = 1;
		res = tol;
		fromcurrent = 1;
		SolveSOR(one,F,result,residual,scratch,overrelax,res,fromcurrent,-1);
		//                cout << "SSOR iter = " << i <<  " res = " << res << endl;
	}
	numiterations = i;
	tol = res;
}